

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QRegion __thiscall QWidgetPrivate::clipRegion(QWidgetPrivate *this)

{
  long lVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  int iVar4;
  Representation RVar5;
  QWidgetData *pQVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long in_RSI;
  Representation RVar11;
  int iVar12;
  Representation RVar13;
  QWidget *pQVar14;
  long in_FS_OFFSET;
  QRegion local_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QWidget **)(in_RSI + 8);
  pQVar6 = pQVar2->data;
  if ((pQVar6->widget_attributes & 0x8000) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_002fc4ff:
      __stack_chk_fail();
    }
    QRegion::QRegion((QRegion *)this);
  }
  else {
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_4_ = (pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i;
    RStack_3c.m_i = (pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i;
    local_48._0_8_ = (QRegionData *)0x0;
    QRegion::QRegion((QRegion *)this,(QRect *)local_48,Rectangle);
    pQVar6 = pQVar2->data;
    if ((pQVar6->widget_attributes & 0x8000) != 0) {
      iVar10 = 0;
      iVar12 = 0;
      pQVar14 = pQVar2;
      do {
        if ((((pQVar6->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) ||
           (*(long *)(*(long *)&pQVar14->field_0x8 + 0x10) == 0)) break;
        iVar4 = QWidget::x(pQVar14);
        iVar12 = iVar12 - iVar4;
        iVar4 = QWidget::y(pQVar14);
        iVar10 = iVar10 - iVar4;
        pQVar3 = *(QWidget **)(*(long *)&pQVar14->field_0x8 + 0x10);
        pQVar6 = pQVar3->data;
        QRegion::QRegion((QRegion *)local_48,iVar12,iVar10,
                         ((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1,
                         ((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1,Rectangle);
        QRegion::operator&=((QRegion *)this,(QRegion *)local_48);
        QRegion::~QRegion((QRegion *)local_48);
        lVar7 = *(long *)&pQVar3->field_0x8;
        uVar8 = 0;
        do {
          uVar9 = uVar8 + 1;
          lVar1 = uVar8 * 8;
          uVar8 = uVar9;
        } while (*(QWidget **)(*(long *)(lVar7 + 0x20) + lVar1) != pQVar14);
        if ((uVar9 & 0xffffffff) < *(ulong *)(lVar7 + 0x28)) {
          do {
            pQVar14 = *(QWidget **)(*(long *)(lVar7 + 0x20) + uVar9 * 8);
            if ((((pQVar14 != (QWidget *)0x0) &&
                 ((*(byte *)(*(long *)&pQVar14->field_0x8 + 0x30) & 1) != 0)) &&
                ((pQVar14->data->widget_attributes & 0x8000) != 0)) &&
               (((pQVar14->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
              local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
              iVar4 = QWidget::x(pQVar14);
              RVar13.m_i = iVar4 + iVar12;
              iVar4 = QWidget::y(pQVar14);
              RVar5.m_i = iVar4 + iVar10;
              pQVar6 = pQVar14->data;
              local_48._8_4_ = ((pQVar6->crect).x2.m_i + RVar13.m_i) - (pQVar6->crect).x1.m_i;
              RStack_3c.m_i = ((pQVar6->crect).y2.m_i + RVar5.m_i) - (pQVar6->crect).y1.m_i;
              local_48._4_4_ = RVar5.m_i;
              local_48._0_4_ = RVar13.m_i;
              pQVar6 = pQVar2->data;
              RVar11.m_i = (pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i;
              if (RVar13.m_i < 1) {
                RVar13.m_i = 0;
              }
              if ((int)local_48._8_4_ < RVar11.m_i) {
                RVar11.m_i = local_48._8_4_;
              }
              if (RVar13.m_i <= RVar11.m_i) {
                RVar13.m_i = (pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i;
                if (RVar5.m_i < 1) {
                  RVar5.m_i = 0;
                }
                if (RStack_3c.m_i < RVar13.m_i) {
                  RVar13.m_i = RStack_3c.m_i;
                }
                if (RVar5.m_i <= RVar13.m_i) {
                  QRegion::QRegion(&local_50,(QRect *)local_48,Rectangle);
                  QRegion::operator-=((QRegion *)this,&local_50);
                  QRegion::~QRegion(&local_50);
                }
              }
              lVar7 = *(long *)&pQVar3->field_0x8;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(ulong *)(lVar7 + 0x28));
        }
        pQVar6 = pQVar3->data;
        pQVar14 = pQVar3;
      } while ((pQVar6->widget_attributes & 0x8000) != 0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_002fc4ff;
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QWidgetPrivate::clipRegion() const
{
    Q_Q(const QWidget);
    if (!q->isVisible())
        return QRegion();
    QRegion r(q->rect());
    const QWidget * w = q;
    const QWidget *ignoreUpTo;
    int ox = 0;
    int oy = 0;
    while (w
           && w->isVisible()
           && !w->isWindow()
           && w->parentWidget()) {
        ox -= w->x();
        oy -= w->y();
        ignoreUpTo = w;
        w = w->parentWidget();
        r &= QRegion(ox, oy, w->width(), w->height());

        int i = 0;
        while(w->d_func()->children.at(i++) != static_cast<const QObject *>(ignoreUpTo))
            ;
        for ( ; i < w->d_func()->children.size(); ++i) {
            if (QWidget *sibling = qobject_cast<QWidget *>(w->d_func()->children.at(i))) {
                if (sibling->isVisible() && !sibling->isWindow()) {
                    QRect siblingRect(ox+sibling->x(), oy+sibling->y(),
                                      sibling->width(), sibling->height());
                    if (qRectIntersects(siblingRect, q->rect()))
                        r -= QRegion(siblingRect);
                }
            }
        }
    }
    return r;
}